

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O0

void __thiscall dlib::drawable::set_pos(drawable *this,long x,long y)

{
  rectangle *this_00;
  rectangle *rhs;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  rectangle *in_stack_00000008;
  base_window *in_stack_00000010;
  unsigned_long height;
  unsigned_long width;
  rectangle old;
  rectangle *in_stack_ffffffffffffff88;
  unsigned_long in_stack_ffffffffffffff98;
  rmutex *in_stack_ffffffffffffffa0;
  
  rmutex::lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (rectangle *)rectangle::width(in_stack_ffffffffffffff88);
  rhs = (rectangle *)rectangle::height(in_stack_ffffffffffffff88);
  rectangle::set_top((rectangle *)(in_RDI + 8),in_RDX);
  rectangle::set_left((rectangle *)(in_RDI + 8),in_RSI);
  rectangle::set_right((rectangle *)(in_RDI + 8),(long)this_00 + in_RSI + -1);
  rectangle::set_bottom((rectangle *)(in_RDI + 8),(long)rhs + in_RDX + -1);
  rectangle::operator+(this_00,rhs);
  base_window::invalidate_rectangle(in_stack_00000010,in_stack_00000008);
  rmutex::unlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

virtual void set_pos (
            long x,
            long y
        )
        {
            m.lock();       
            rectangle old(rect);            

            const unsigned long width = rect.width();
            const unsigned long height = rect.height();
            rect.set_top(y);
            rect.set_left(x);
            rect.set_right(static_cast<long>(x+width)-1);
            rect.set_bottom(static_cast<long>(y+height)-1);
            
            parent.invalidate_rectangle(rect+old);
            m.unlock();
        }